

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.h
# Opt level: O0

int64_t __thiscall aeron::ClientConductor::channelStatus(ClientConductor *this,int32_t counterId)

{
  int in_ESI;
  long in_RDI;
  undefined8 local_8;
  
  if (in_ESI == -1) {
    local_8 = 1;
  }
  else if (in_ESI == 0) {
    local_8 = 0;
  }
  else {
    local_8 = concurrent::CountersReader::getCounterValue((CountersReader *)(in_RDI + 0xd8),in_ESI);
  }
  return local_8;
}

Assistant:

inline std::int64_t channelStatus(std::int32_t counterId) const
    {
        switch (counterId)
        {
            case 0:
                return ChannelEndpointStatus::CHANNEL_ENDPOINT_INITIALIZING;

            case ChannelEndpointStatus::NO_ID_ALLOCATED:
                return ChannelEndpointStatus::CHANNEL_ENDPOINT_ACTIVE;

            default:
                return m_countersReader.getCounterValue(counterId);
        }
    }